

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O1

void pnga_strided_acc(Integer g_a,Integer *lo,Integer *hi,Integer *skip,void *buf,Integer *ld,
                     void *alpha)

{
  long *plVar1;
  short sVar2;
  long lVar3;
  Integer *__src;
  uint uVar4;
  int iVar5;
  Integer IVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  char *dst_ptr;
  ulong uVar12;
  long ndim;
  ulong icode;
  int proc;
  int local_504;
  int local_500;
  uint local_4fc;
  Integer *local_4f8;
  Integer *local_4f0;
  char *prem;
  Integer *blo;
  ulong local_4d8;
  Integer *bhi;
  Integer local_4c8;
  long local_4c0;
  void *local_4b8;
  Integer nstride;
  Integer plo [7];
  int stride_rem [14];
  Integer phi [7];
  int stride_loc [14];
  int count [14];
  Integer ldrem [7];
  _iterator_hdl it_hdl;
  
  local_500 = GA[g_a + 1000].elemsize;
  sVar2 = GA[g_a + 1000].ndim;
  local_4fc = (uint)sVar2;
  ndim = (long)(int)local_4fc;
  iVar5 = GA[g_a + 1000].type;
  local_4f8 = hi;
  local_4f0 = lo;
  local_4c8 = g_a;
  local_4b8 = buf;
  pnga_nnodes();
  local_4c0 = (long)GA[g_a + 1000].p_handle;
  uVar4 = iVar5 - 0x3e9;
  if ((uVar4 < 7) && ((0x6fU >> (uVar4 & 0x1f) & 1) != 0)) {
    local_504 = *(int *)(&DAT_001bccc8 + (ulong)uVar4 * 4);
  }
  else {
    pnga_error("nga_strided_acc: type not supported",(long)iVar5);
    local_504 = -1;
  }
  uVar12 = (ulong)local_4fc;
  if (0 < sVar2) {
    icode = 0;
    do {
      if (skip[icode] < 1) {
        pnga_error("nga_strided_acc: Invalid value of skip along coordinate ",icode);
      }
      icode = icode + 1;
    } while (uVar12 != icode);
  }
  local_4d8 = uVar12;
  gai_iterator_init(local_4c8,local_4f0,local_4f8,&it_hdl);
  iVar5 = gai_iterator_next(&it_hdl,&proc,&blo,&bhi,&prem,ldrem);
  if (iVar5 != 0) {
    local_4f8 = (Integer *)(long)local_500;
    local_4d8 = local_4d8 << 3;
    do {
      __src = bhi;
      uVar12 = local_4d8;
      if (0 < sVar2) {
        memcpy(plo,blo,local_4d8);
        memcpy(phi,__src,uVar12);
      }
      IVar6 = gai_correct_strided_patch(ndim,local_4f0,skip,plo,phi);
      if (IVar6 != 0) {
        if (sVar2 < 1) {
          lVar11 = 0;
        }
        else {
          lVar11 = 0;
          lVar8 = 0;
          lVar9 = 1;
          do {
            lVar10 = lVar9;
            if (lVar8 < ndim + -1) {
              lVar10 = ldrem[lVar8] * lVar9;
            }
            lVar11 = lVar11 + (plo[lVar8] - blo[lVar8]) * lVar9;
            lVar8 = lVar8 + 1;
            lVar9 = lVar10;
          } while (ndim != lVar8);
        }
        dst_ptr = prem + lVar11 * (long)local_4f8;
        lVar11 = (plo[0] - *local_4f0) / *skip;
        if (1 < sVar2) {
          lVar9 = 0;
          do {
            lVar3 = lVar9 + 1;
            lVar8 = lVar9 + 1;
            lVar10 = lVar9 + 1;
            plVar1 = ld + lVar9;
            lVar9 = lVar9 + 1;
            lVar11 = lVar11 + ((plo[lVar3] - local_4f0[lVar8]) / skip[lVar10]) * *plVar1;
          } while (ndim + -1 != lVar9);
        }
        prem = dst_ptr;
        iVar5 = gai_ComputeCountWithSkip(ndim,plo,phi,skip,count,&nstride);
        if (iVar5 != 0) {
          count[0] = count[0] * local_500;
          stride_loc[0] = local_500;
          stride_rem[0] = local_500;
          if (0 < (short)local_4fc) {
            lVar9 = 0;
            iVar5 = local_500;
            iVar7 = local_500;
            do {
              stride_rem[lVar9 + 1] = iVar7;
              stride_rem[lVar9] = (int)skip[lVar9] * iVar7;
              iVar7 = iVar7 * (int)ldrem[lVar9];
              stride_rem[lVar9 + 1] = iVar7;
              stride_loc[lVar9 + 1] = iVar5;
              iVar5 = iVar5 * (int)ld[lVar9];
              stride_loc[lVar9 + 1] = iVar5;
              lVar9 = lVar9 + 1;
            } while (ndim != lVar9);
          }
          if ((int)local_4c0 != -1) {
            proc = PGRP_LIST[local_4c0].inv_map_proc_list[proc];
          }
          ARMCI_AccS(local_504,alpha,(void *)(lVar11 * (long)local_4f8 + (long)local_4b8),stride_loc
                     ,dst_ptr,stride_rem,count,(int)nstride + -1,proc);
        }
      }
      iVar5 = gai_iterator_next(&it_hdl,&proc,&blo,&bhi,&prem,ldrem);
    } while (iVar5 != 0);
  }
  gai_iterator_destroy(&it_hdl);
  return;
}

Assistant:

void pnga_strided_acc(Integer g_a, Integer *lo, Integer *hi, Integer *skip,
                      void *buf, Integer *ld, void *alpha)
{
  /* g_a:    Global Array handle
     lo[]:   Array of lower indices of patch of global array
     hi[]:   Array of upper indices of patch of global array
     skip[]: Array of skips for each dimension
     buf[]:  Local buffer that patch will be copied from
     ld[]:   ndim-1 physical dimensions of local buffer
     alpha:  muliplicative scale factor */
  Integer p, np=0, handle = GA_OFFSET + g_a;
  Integer idx, size, nstride, type, p_handle, nproc;
  int i, optype=-1, proc, ndim;
  Integer ldrem[MAXDIM];
  Integer idx_buf, *blo, *bhi;
  Integer plo[MAXDIM],phi[MAXDIM];
  char *pbuf, *prem;
  int count[2*MAXDIM], stride_rem[2*MAXDIM], stride_loc[2*MAXDIM];
  _iterator_hdl it_hdl;

  size = GA[handle].elemsize;
  ndim = GA[handle].ndim;
  type = GA[handle].type;
  nproc = pnga_nnodes();
  p_handle = GA[handle].p_handle;

  if (type == C_DBL) optype = ARMCI_ACC_DBL;
  else if (type == C_FLOAT) optype = ARMCI_ACC_FLT;
  else if (type == C_DCPL) optype = ARMCI_ACC_DCP;
  else if (type == C_SCPL) optype = ARMCI_ACC_CPL;
  else if (type == C_INT) optype = ARMCI_ACC_INT;
  else if (type == C_LONG) optype = ARMCI_ACC_LNG;
  else pnga_error("nga_strided_acc: type not supported",type);

  /* check values of skips to make sure they are legitimate */
  for (i = 0; i<ndim; i++) {
    if (skip[i]<1) {
      pnga_error("nga_strided_acc: Invalid value of skip along coordinate ",i);
    }
  }

  gai_iterator_init(g_a, lo, hi, &it_hdl);
  while (gai_iterator_next(&it_hdl, &proc, &blo, &bhi, &prem, ldrem)) {
      /* Correct ranges to account for skips in original patch. If no
         data is left in patch jump to next processor in loop. */
      for (i=0; i<ndim; i++) {
        plo[i] = blo[i];
        phi[i] = bhi[i];
      }
      if (!gai_correct_strided_patch((Integer)ndim, lo, skip, plo, phi))
        continue;
      /* May need to correct location of remote buffer */
      gai_FindOffset(ndim,blo,plo,ldrem,&idx_buf);
      prem += size*idx_buf;

      /* get pointer in local buffer to point indexed by plo given that
         the corner of the buffer corresponds to the point indexed by lo */
      gai_ComputePatchIndexWithSkip(ndim, lo, plo, skip, ld, &idx_buf);
      pbuf = size*idx_buf + (char*)buf;

      /* Compute number of elements in each stride region and compute the
         number of stride regions. Store the results in count and nstride */
      if (!gai_ComputeCountWithSkip(ndim, plo, phi, skip, count, &nstride))
        continue;

      /* Scale first element in count by element size. The ARMCI_PutS routine
         uses this convention to figure out memory sizes. */
      count[0] *= size;

      /* Calculate strides in memory for remote processor indexed by proc and
         local buffer */ 
      gai_SetStrideWithSkip(ndim, size, ld, ldrem, stride_rem, stride_loc,
          skip);

      /* BJP */
      if (p_handle != -1) {
        proc = PGRP_LIST[p_handle].inv_map_proc_list[proc];
      }
      ARMCI_AccS(optype, alpha, pbuf, stride_loc, prem, stride_rem, count,
          nstride-1, proc);
  }
  gai_iterator_destroy(&it_hdl);
}